

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O1

int dodip(obj *potion)

{
  short sVar1;
  bool bVar2;
  boolean bVar3;
  char cVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  obj *poVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  int tmp;
  int iVar14;
  ushort uVar15;
  char *pcVar16;
  obj *poVar17;
  obj *poVar18;
  int y;
  int iVar19;
  bool bVar20;
  byte bVar21;
  char allowall [2];
  char qbuf [128];
  char buf [256];
  char Your_buf [256];
  char newbuf [256];
  obj *local_430;
  obj *local_428;
  char local_41e [2];
  int local_41c;
  char local_418 [128];
  char local_398 [256];
  char local_298 [256];
  char local_198 [256];
  obj local_98;
  
  bVar21 = 0;
  local_41e[0] = '\x14';
  local_41e[1] = '\0';
  if ((potion != (obj *)0x0) && (bVar3 = validate_object(potion,"\b","dip into"), bVar3 == '\0')) {
    return 0;
  }
  poVar9 = getobj(local_41e,"dip",(obj **)0x0);
  if (poVar9 == (obj *)0x0) {
    return 0;
  }
  if (potion == (obj *)0x0) {
    if (level->locations[u.ux][u.uy].typ == '\x1c') {
      pcVar10 = xname(poVar9);
      pcVar10 = the(pcVar10);
      pcVar11 = simple_typename((int)poVar9->otyp);
      pcVar11 = the(pcVar11);
      pcVar10 = safe_qbuf("",0x18,pcVar10,pcVar11,"this item");
      sprintf(local_418,"Dip %s into the fountain?",pcVar10);
      cVar4 = yn_function(local_418,"yn",'n');
      if (cVar4 == 'y') {
        dipfountain(poVar9);
        return 1;
      }
    }
    else {
      bVar3 = is_pool(level,(int)u.ux,(int)u.uy);
      if ((bVar3 != '\0') || (bVar3 = is_swamp(level,(int)u.ux,(int)u.uy), bVar3 != '\0')) {
        pcVar10 = waterbody_name(u.ux,u.uy);
        pcVar11 = xname(poVar9);
        pcVar11 = the(pcVar11);
        pcVar16 = simple_typename((int)poVar9->otyp);
        pcVar16 = the(pcVar16);
        pcVar11 = safe_qbuf("",0x1d,pcVar11,pcVar16,"this item");
        sprintf(local_418,"Dip %s into the %s?",pcVar11,pcVar10);
        cVar4 = yn_function(local_418,"yn",'n');
        if (cVar4 == 'y') {
          if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
             ((youmonst.data)->mlet == '\x05')) {
            floating_above(pcVar10);
            return 1;
          }
          if (((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 2) == 0)) &&
             (u.weapon_skills[0x27].skill < '\x02')) {
            rider_cant_reach();
            return 1;
          }
          get_wet(poVar9);
          if (poVar9->otyp == 0x141) {
            useup(poVar9);
            return 1;
          }
          return 1;
        }
      }
    }
    pcVar10 = xname(poVar9);
    pcVar10 = the(pcVar10);
    pcVar11 = simple_typename((int)poVar9->otyp);
    pcVar11 = the(pcVar11);
    pcVar10 = safe_qbuf("",10,pcVar10,pcVar11,"this item");
    sprintf(local_418,"dip %s into",pcVar10);
    potion = getobj("\b",local_418,(obj **)0x0);
  }
  if (potion == (obj *)0x0) {
    return 0;
  }
  if ((potion == poVar9) && (potion->quan == 1)) {
    pline("That is a potion bottle, not a Klein bottle!");
    return 0;
  }
  uVar7 = *(uint *)&potion->field_0x4a;
  *(uint *)&potion->field_0x4a = uVar7 | 0x800000;
  sVar5 = potion->otyp;
  local_430 = poVar9;
  local_428 = potion;
  if ((long)sVar5 != 0x14f) {
    sVar1 = poVar9->otyp;
    if (sVar5 != 0x13a && (long)sVar1 != 0x13a) {
      if ((sVar1 != sVar5) && (poVar9->oclass == '\b')) {
        if (((uVar7 & 0x20) == 0) || ((poVar9->field_0x4a & 0x20) == 0)) {
          pline("The potions mix...");
        }
        else {
          pline("You mix the %s potion with the %s one ...",
                obj_descr[objects[sVar5].oc_descr_idx].oc_descr,
                obj_descr[objects[sVar1].oc_descr_idx].oc_descr);
        }
        if (((((local_430->field_0x4a & 1) != 0) || (local_430->otyp == 0x141)) ||
            (local_428->otyp == 0x141)) ||
           (uVar7 = mt_random(),
           (uVar7 * -0x33333333 >> 1 | (uint)((uVar7 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)
           ) {
          pline("BOOM!  They explode!");
          exercise(0,'\0');
          if ((~(youmonst.data)->mflags1 & 0x1400) != 0) {
            potionbreathe(local_430);
          }
          useup(local_430);
          useup(local_428);
          bVar20 = (youmonst.mintrinsics & 0x40) == 0 && u.uprops[7].extrinsic == 0;
          uVar7 = mt_random();
          losehp(uVar7 % ((uint)bVar20 + (uint)bVar20 * 4 + 5) + 1,"alchemic blast",0);
          return 1;
        }
        *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a & 0xffffffbc;
        if (((((u.uprops[0x1e].intrinsic != 0) ||
              ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
            ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
           (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
            ((u.umonnum == u.umonster || (bVar3 = dmgtype(youmonst.data,0x24), bVar3 == '\0')))))) {
          *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a & 0xffffffdf;
        }
        sVar5 = mixtype(local_430,local_428);
        if (sVar5 == 0) {
          iVar8 = 1;
          if ((local_430->field_0x4b & 3) == 0) {
            uVar7 = mt_random();
            iVar8 = (uVar7 & 7) + 1;
          }
          if (iVar8 - 2U < 2) {
            local_430->otyp = 0x13f;
          }
          else if (iVar8 == 4) {
            poVar9 = mkobj(level,'\b','\0');
            local_430->otyp = poVar9->otyp;
            obfree(poVar9,(obj *)0x0);
          }
          else {
            if (iVar8 != 1) {
              if (((u.uprops[0x1e].intrinsic == 0) &&
                  (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                pline("The mixture glows brightly and evaporates.");
              }
              useup(local_430);
              goto LAB_00220bbb;
            }
            local_430->otyp = 0x14f;
          }
        }
        else {
          local_430->otyp = sVar5;
        }
        *(uint *)&local_430->field_0x4a =
             *(uint *)&local_430->field_0x4a & 0xfffffcff | (uint)(local_430->otyp != 0x14f) << 8;
        if ((local_430->otyp == 0x14f) &&
           (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
            ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))))) {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)) {
            pcVar10 = ", then clears";
          }
          else if (ublindf == (obj *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = "";
            if (ublindf->oartifact == '\x1d') {
              pcVar10 = ", then clears";
            }
          }
          pcVar11 = "The mixture bubbles%s.";
        }
        else {
          if (((u.uprops[0x1e].intrinsic != 0) ||
              (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
             ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_00221206;
          pcVar10 = hcolor(obj_descr[objects[local_430->otyp].oc_descr_idx].oc_descr);
          pcVar11 = "The mixture looks %s.";
        }
        pline(pcVar11,pcVar10);
LAB_00221206:
        useup(local_428);
        local_430->quan = local_430->quan + 1;
        uVar7 = weight(local_430);
        local_430->owt = uVar7;
        return 1;
      }
      iVar8 = dip_diluted_same_potions(&local_428,&local_430);
      if (iVar8 != 0) goto LAB_00220185;
      goto LAB_00220225;
    }
    iVar8 = dip_diluted_same_potions(&local_428,&local_430);
    if (iVar8 != 0) {
LAB_00220185:
      *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
      prinv((char *)0x0,local_428,0);
      return 1;
    }
    sVar5 = local_430->otyp;
    if (((((sVar5 != 0xcf) && (sVar5 != 0x19e)) && (sVar5 != 0x1c9)) &&
        ((sVar5 != local_428->otyp && (local_430 != uball)))) && (local_430 != uskin)) {
      poVar9 = local_430;
      if (sVar5 == 0x13a) {
        poVar9 = local_428;
      }
      bVar3 = obj_resists(poVar9,5,0x5f);
      poVar17 = local_430;
      poVar9 = uwep;
      if (bVar3 == '\0') {
        sVar5 = local_430->otyp;
        u.uconduct.polypiles = u.uconduct.polypiles + 1;
        bVar20 = true;
        if (local_430 == uwep) {
LAB_00220a42:
          bVar2 = true;
        }
        else {
          if (local_430 != uswapwep) {
            bVar20 = local_430 != uquiver;
            goto LAB_00220a42;
          }
          bVar2 = false;
        }
        local_430 = poly_obj(local_430,0);
        if (poVar17 == poVar9) {
          setuwep(local_430);
        }
        else if (bVar2) {
          if (!bVar20) {
            setuqwep(local_430);
          }
        }
        else {
          setuswapwep(local_430);
        }
        if (local_430->otyp != sVar5) {
          discover_object(0x13a,'\x01','\x01');
          useup(local_428);
          prinv((char *)0x0,local_430,0);
          return 1;
        }
        pline("Nothing seems to happen.");
        goto LAB_00220394;
      }
    }
    pline("Nothing happens.");
LAB_00220022:
    *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
    return 1;
  }
  if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
     (((youmonst.data)->mflags1 & 0x1000) == 0)) {
    bVar20 = false;
  }
  else if (ublindf == (obj *)0x0) {
    bVar20 = true;
  }
  else {
    bVar20 = ublindf->oartifact != '\x1d';
  }
  if (!bVar20) {
    Shk_Your(local_298,poVar9);
  }
  if ((*(uint *)&local_428->field_0x4a & 2) == 0) {
    if ((*(uint *)&local_428->field_0x4a & 1) != 0) {
      if ((*(uint *)&local_430->field_0x4a & 2) == 0) {
        if ((*(uint *)&local_430->field_0x4a & 1) != 0) goto LAB_00220225;
        if (!bVar20) {
          pcVar10 = hcolor("black");
          pcVar11 = aobjnam(local_430,"glow");
          pcVar16 = strchr("aeiouAEIOU",(int)*pcVar10);
          pcVar12 = "n";
          if (pcVar16 == (char *)0x0) {
            pcVar12 = "";
          }
          pline("%s %s with a%s %s aura.",local_298,pcVar11,pcVar12,pcVar10);
        }
        curse(local_430);
      }
      else {
        if (!bVar20) {
          pcVar10 = aobjnam(local_430,"glow");
          pcVar11 = hcolor("brown");
          pline("%s %s %s.",local_298,pcVar10,pcVar11);
        }
        unbless(local_430);
      }
      goto LAB_0022038b;
    }
    bVar3 = get_wet(local_430);
    if (bVar3 != '\0') goto LAB_00220394;
LAB_00220225:
    uVar15 = local_428->otyp;
    if ((((uVar15 == 0x141) && (local_430->otyp == 0x10e)) && (local_430->corpsenm == 0xa3)) &&
       ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      pcVar10 = cxname(local_430);
      pcVar10 = The(pcVar10);
      pcVar11 = otense(local_430,"turn");
      pcVar16 = "orange";
      if ((*(uint *)&local_428->field_0x4a & 0x300) == 0) {
        pcVar16 = "red";
      }
      pline("%s %s %s around the edges.",pcVar10,pcVar11,pcVar16);
      goto LAB_00220022;
    }
    cVar4 = local_430->oclass;
    if ((cVar4 != '\x02') || (4 < (byte)(objects[local_430->otyp].oc_subtyp + 0x1aU))) {
LAB_00220410:
      if (uVar15 != 0x142) {
LAB_0022041b:
        if ((uVar15 == 0x142) && ((local_430->otyp & 0xfffeU) == 0xe8)) {
          if (((local_430->field_0x4c & 8) != 0) || ((local_428->field_0x4c & 8) != 0)) {
            useup(local_428);
            iVar14 = (int)u.ux;
            y = (int)u.uy;
            iVar8 = 6;
            iVar19 = -6;
            do {
              uVar7 = mt_random();
              iVar8 = iVar8 + uVar7 % 6;
              iVar19 = iVar19 + 1;
            } while (iVar19 != 0);
            explode(iVar14,y,0xb,iVar8,'\0',5);
            exercise(2,'\0');
            return 1;
          }
          if ((local_430->otyp == 0xe9) && (local_430->spe == '\0')) {
            local_430->otyp = 0xe8;
            local_430->age = 0;
          }
          if (local_430->age < 0x3e9) {
            pcVar10 = yname(local_430);
            pline("You fill %s with oil.",pcVar10);
            check_unpaid(local_428);
            iVar8 = local_428->age * 2 + local_430->age;
            if (0x5db < iVar8) {
              iVar8 = 0x5dc;
            }
            local_430->age = iVar8;
            useup(local_428);
            exercise(2,'\x01');
          }
          else {
            pcVar10 = Yname2(local_430);
            pcVar11 = otense(local_430,"are");
            pline("%s %s full.",pcVar10,pcVar11);
            *(uint *)&local_428->field_0x4a = *(uint *)&local_428->field_0x4a & 0xff7fffff;
          }
          discover_object(0x142,'\x01','\x01');
          local_430->spe = '\x01';
        }
        else {
          local_428->field_0x4c = local_428->field_0x4c & 0x7f;
          if (((local_430->otyp != 0x200) && (local_430->otyp != 0x10a)) ||
             (sVar5 = mixtype(local_430,local_428), sVar5 == 0)) {
            pline("Interesting...");
            return 1;
          }
          sVar1 = local_428->otyp;
          local_41c = local_428->quan;
          local_398[0] = '\0';
          uVar7 = *(uint *)&local_428->field_0x4a;
          if ((uVar7 & 0x20) != 0) {
            pcVar10 = hcolor(obj_descr[objects[sVar1].oc_descr_idx].oc_descr);
            sprintf(local_398,"%s ",pcVar10);
          }
          poVar9 = local_428;
          if (1 < local_428->quan) {
            poVar9 = splitobj(local_428,1);
          }
          if (((poVar9->field_0x4a & 4) != 0) && (bVar3 = costly_spot(u.ux,u.uy), bVar3 != '\0')) {
            pline("You use it, you pay for it.");
            bill_dummy_object(poVar9);
          }
          poVar9->otyp = sVar5;
          uVar6 = *(uint *)&poVar9->field_0x4a;
          *(uint *)&poVar9->field_0x4a = uVar6 & 0xfffffffd;
          if (sVar5 == 0x14f) {
            uVar6 = uVar6 & 0xfffffcfc;
          }
          else {
            uVar6 = uVar6 & 0xfffffffc | *(uint *)&local_430->field_0x4a & 1;
          }
          *(uint *)&poVar9->field_0x4a = uVar6 & 0xffffffbf;
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            uVar6 = 0x20;
            if ((u.uprops[0x23].intrinsic != 0) &&
               ((u.uprops[0x24].extrinsic == 0 && (uVar6 = 0, u.umonnum != u.umonster)))) {
              bVar3 = dmgtype(youmonst.data,0x24);
              uVar6 = (uint)(bVar3 != '\0') << 5;
            }
            *(uint *)&poVar9->field_0x4a = *(uint *)&poVar9->field_0x4a & 0xffffffdf | uVar6;
            if ((sVar5 == 0x14f) && (uVar6 != 0)) {
              builtin_strncpy(local_198,"clears",7);
            }
            else {
              pcVar10 = hcolor(obj_descr[objects[sVar5].oc_descr_idx].oc_descr);
              sprintf(local_198,"turns %s",pcVar10);
            }
            pcVar10 = "";
            if (1 < local_41c) {
              pcVar10 = " that you dipped into";
            }
            pline("The %spotion%s %s.",local_398,pcVar10,local_198);
            if (((objects[sVar1].oc_uname == (char *)0x0) && ((uVar7 & 0x20) != 0)) &&
               ((objects[sVar1].field_0x10 & 1) == 0)) {
              poVar17 = &zeroobj;
              poVar18 = &local_98;
              for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
                poVar18->nobj = poVar17->nobj;
                poVar17 = (obj *)((long)poVar17 + ((ulong)bVar21 * -2 + 1) * 8);
                poVar18 = (obj *)((long)poVar18 + (ulong)bVar21 * -0x10 + 8);
              }
              local_98._74_1_ = local_98._74_1_ | 0x20;
              local_98.oclass = '\b';
              local_98.otyp = sVar1;
              docall(&local_98);
            }
          }
          else {
            *(uint *)&poVar9->field_0x4a = uVar6 & 0xffffff9f;
          }
          obj_extract_self(poVar9);
          pcVar10 = doname(poVar9);
          hold_another_object(poVar9,"You juggle and drop %s!",pcVar10,(char *)0x0);
        }
        update_inventory();
        return 1;
      }
      if ((*(uint *)&local_428->field_0x4a >> 0x13 & 1) == 0) {
        if ((*(uint *)&local_428->field_0x4a & 1) != 0) {
          pcVar10 = body_part(3);
          pcVar10 = makeplural(pcVar10);
          pline("The potion spills and covers your %s with oil.",pcVar10);
          iVar8 = 2;
          iVar14 = -2;
          do {
            uVar7 = mt_random();
            iVar8 = iVar8 + uVar7 % 10;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar6 = (u.uprops[0x29].intrinsic & 0xffffff) + iVar8;
          uVar7 = 0xffffff;
          if (uVar6 < 0xffffff) {
            uVar7 = uVar6;
          }
          u.uprops[0x29].intrinsic = uVar7 | u.uprops[0x29].intrinsic & 0xff000000;
          goto LAB_002209f4;
        }
        if ((cVar4 != '\x02') && ((cVar4 != '\x06' || (objects[local_430->otyp].oc_subtyp == '\0')))
           ) goto LAB_0022041b;
        uVar15 = *(ushort *)&objects[local_430->otyp].field_0x11 >> 4 & 0x1f;
        if ((((uVar15 != 0xd) && (uVar15 != 0xb)) ||
            (((cVar4 == '\r' || (cVar4 == '\x02')) &&
             ((byte)(objects[local_430->otyp].oc_subtyp + 0x18U) < 3)))) ||
           ((local_430->field_0x4b & 0xf) == 0)) {
          pcVar10 = Yname2(local_430);
          pcVar11 = otense(local_430,"gleam");
          pcVar16 = "%s %s with an oily sheen.";
          goto LAB_00220b85;
        }
        pcVar10 = Yname2(local_430);
        pcVar11 = otense(local_430,"are");
        pcVar16 = "corroded and rusty";
        if ((*(uint *)&local_430->field_0x4a & 0xc00) == 0) {
          pcVar16 = "rusty";
        }
        pcVar12 = "corroded";
        if ((*(uint *)&local_430->field_0x4a & 0x300) != 0) {
          pcVar12 = pcVar16;
        }
        pline("%s %s less %s.",pcVar10,pcVar11,pcVar12);
        uVar7 = *(uint *)&local_430->field_0x4a;
        if ((uVar7 & 0x300) != 0) {
          *(uint *)&local_430->field_0x4a = uVar7 & 0xfffffcff | uVar7 + 0x300 & 0x300;
        }
        uVar7 = *(uint *)&local_430->field_0x4a;
        bVar3 = '\x01';
        if ((uVar7 & 0xc00) != 0) {
          *(uint *)&local_430->field_0x4a = uVar7 & 0xfffff3ff | uVar7 + 0xc00 & 0xc00;
        }
      }
      else {
        uVar15 = *(ushort *)&objects[local_430->otyp].field_0x11;
        bVar3 = catch_lit(local_430);
        if (bVar3 == '\0') {
          if ((((local_430->field_0x4b & 0x10) != 0) ||
              (bVar3 = obj_resists(local_430,5,0x5f), bVar3 != '\0')) ||
             ((bVar3 = is_flammable(local_430), bVar3 == '\0' || (local_430->oclass == '\a')))) {
            pcVar10 = Yname2(local_430);
            pcVar11 = otense(local_430,"seem");
            pcVar16 = "%s %s to burn for a moment.";
LAB_00220b85:
            bVar3 = '\0';
            pline(pcVar16,pcVar10,pcVar11);
            goto LAB_00220b95;
          }
          uVar15 = uVar15 >> 4 & 0x1f;
          if (((uVar15 == 0x12) || (uVar15 == 5)) && (local_430->oartifact == '\0')) {
            local_430->field_0x4b = local_430->field_0x4b | 3;
          }
          pcVar10 = "damages";
          if ((~*(uint *)&local_430->field_0x4a & 0x300) == 0) {
            pcVar10 = "destroys";
          }
          pcVar11 = yname(local_430);
          pline("The burning oil %s %s.",pcVar10,pcVar11);
          if ((~*(uint *)&local_430->field_0x4a & 0x300) == 0) {
            obj_extract_self(local_430);
            bVar3 = '\0';
            obfree(local_430,(obj *)0x0);
            local_430 = (obj *)0x0;
            goto LAB_00220b95;
          }
          if ((*(uint *)&local_430->field_0x4a & 4) != 0) {
            verbalize("You burnt it, you bought it!");
            bill_dummy_object(local_430);
          }
          *(uint *)&local_430->field_0x4a =
               *(uint *)&local_430->field_0x4a & 0xfffffcff |
               *(uint *)&local_430->field_0x4a + 0x100 & 0x300;
        }
LAB_002209f4:
        bVar3 = '\0';
      }
LAB_00220b95:
      exercise(2,bVar3);
      discover_object((int)local_428->otyp,'\x01','\x01');
      goto LAB_00220bbb;
    }
    if ((uVar15 == 0x13f) && ((local_430->field_0x4b & 0x80) == 0)) {
      iVar8 = local_428->quan;
      pcVar10 = xname(local_428);
      if (iVar8 < 2) {
        pcVar10 = The(pcVar10);
        strcpy(local_398,pcVar10);
      }
      else {
        pcVar10 = the(pcVar10);
        sprintf(local_398,"One of %s",pcVar10);
      }
      pcVar10 = xname(local_430);
      pcVar10 = the(pcVar10);
      pline("%s forms a coating on %s.",local_398,pcVar10);
      *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a | 0x8000;
    }
    else {
      if ((((local_430->field_0x4b & 0x80) == 0) || (10 < uVar15 - 300)) ||
         ((0x421U >> (uVar15 - 300 & 0x1f) & 1) == 0)) goto LAB_00220410;
      pcVar10 = xname(local_430);
      pcVar10 = the(pcVar10);
      pline("A coating wears off %s.",pcVar10);
      *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a & 0xffff7fff;
    }
  }
  else {
    if ((*(uint *)&local_430->field_0x4a & 1) == 0) {
      if ((*(uint *)&local_430->field_0x4a & 2) != 0) goto LAB_00220225;
      if (!bVar20) {
        pcVar10 = hcolor("light blue");
        pcVar11 = aobjnam(local_430,"softly glow");
        pcVar16 = strchr("aeiouAEIOU",(int)*pcVar10);
        pcVar12 = "n";
        if (pcVar16 == (char *)0x0) {
          pcVar12 = "";
        }
        pline("%s %s with a%s %s aura.",local_298,pcVar11,pcVar12,pcVar10);
      }
      bless(local_430);
    }
    else {
      if (!bVar20) {
        pcVar10 = aobjnam(local_430,"softly glow");
        pcVar11 = hcolor("amber");
        pline("%s %s %s.",local_298,pcVar10,pcVar11);
      }
      uncurse(local_430);
    }
LAB_0022038b:
    *(uint *)&local_430->field_0x4a = *(uint *)&local_430->field_0x4a | 0x40;
  }
LAB_00220394:
  if (((objects[local_428->otyp].field_0x10 & 1) == 0) &&
     (objects[local_428->otyp].oc_uname == (char *)0x0)) {
    docall(local_428);
  }
LAB_00220bbb:
  useup(local_428);
  return 1;
}

Assistant:

int dodip(struct obj *potion)
{
	struct obj *obj;
	const char *tmp;
	uchar here;
	char allowall[2] = {ALL_CLASSES, 0};
	char qbuf[QBUFSZ];

	if (potion && !validate_object(potion, beverages, "dip into"))
		return 0;
	
	obj = getobj(allowall, "dip", NULL);
	if (!obj) return 0;

	if (!potion) {
		here = level->locations[u.ux][u.uy].typ;
		/* Is there a fountain to dip into here? */
		if (IS_FOUNTAIN(here)) {
			sprintf(qbuf, "Dip %s into the fountain?",
				safe_qbuf("", sizeof("Dip  into the fountain?"),
					  the(xname(obj)),
					  the(simple_typename(obj->otyp)),
					  "this item"));
			if (yn(qbuf) == 'y') {
				dipfountain(obj);
				return 1;
			}
		} else if (is_pool(level, u.ux,u.uy) || is_swamp(level, u.ux,u.uy)) {
			tmp = waterbody_name(u.ux,u.uy);
			sprintf(qbuf, "Dip %s into the %s?",
				safe_qbuf("",
					  sizeof("Dip  into the pool of water?"),
					  the(xname(obj)),
					  the(simple_typename(obj->otyp)),
					  "this item"),
				tmp);
			if (yn(qbuf) == 'y') {
			    if (Levitation) {
				floating_above(tmp);
			    } else if (u.usteed && !is_swimmer(u.usteed->data) &&
				    P_SKILL(P_RIDING) < P_BASIC) {
				rider_cant_reach(); /* not skilled enough to reach */
			    } else {
				get_wet(obj);
				if (obj->otyp == POT_ACID) useup(obj);
			    }
			    return 1;
			}
		}
		sprintf(qbuf, "dip %s into",
			safe_qbuf("", sizeof("dip  into"),
				  the(xname(obj)),
				  the(simple_typename(obj->otyp)),
				  "this item"));
		potion = getobj(beverages, qbuf, NULL);
	}

	if (!potion) return 0;
	if (potion == obj && potion->quan == 1L) {
		pline("That is a potion bottle, not a Klein bottle!");
		return 0;
	}

	return dip(potion, obj);
}